

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_copy_propagation_elements.cpp
# Opt level: O1

ir_visitor_status __thiscall
anon_unknown.dwarf_92341::ir_copy_propagation_elements_visitor::visit_leave
          (ir_copy_propagation_elements_visitor *this,ir_assignment *ir)

{
  ushort uVar1;
  ir_node_type iVar2;
  uint uVar3;
  ir_rvalue *piVar4;
  ir_variable *piVar5;
  ir_dereference *piVar6;
  glsl_type *pgVar7;
  byte bVar8;
  bool bVar9;
  int i;
  int iVar10;
  uint write_mask;
  undefined4 extraout_var;
  undefined8 *puVar11;
  ir_variable *piVar12;
  ir_rvalue *piVar13;
  long lVar14;
  int i_1;
  uint uVar15;
  int extraout_EDX;
  int extraout_EDX_00;
  int __sig;
  ir_assignment *mem_ctx;
  uint uVar16;
  long lVar17;
  uint uVar18;
  int orig_swizzle [4];
  ulong local_48;
  ulong uStack_40;
  int local_38 [6];
  
  iVar2 = (ir->lhs->super_ir_rvalue).super_ir_instruction.ir_type;
  mem_ctx = ir;
  iVar10 = (*(ir->lhs->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[8])();
  if ((((iVar2 == ir_type_dereference_variable) &&
       (lVar14 = *(long *)(CONCAT44(extraout_var,iVar10) + 0x20), 1 < *(byte *)(lVar14 + 8))) &&
      (*(char *)(lVar14 + 9) == '\x01')) && ((*(uint *)(lVar14 + 4) & 0xfc) < 0xc)) {
    puVar11 = (undefined8 *)
              (anonymous_namespace)::kill_entry::operator_new((size_t)this->lin_ctx,mem_ctx);
    uVar15 = (byte)ir->field_0x38 & 0xf;
    __sig = extraout_EDX;
  }
  else {
    puVar11 = (undefined8 *)
              (anonymous_namespace)::kill_entry::operator_new((size_t)this->lin_ctx,mem_ctx);
    uVar15 = 0xffffffff;
    __sig = extraout_EDX_00;
  }
  *puVar11 = 0;
  puVar11[1] = 0;
  puVar11[2] = CONCAT44(extraout_var,iVar10);
  *(uint *)(puVar11 + 3) = uVar15;
  kill(this,(__pid_t)puVar11,__sig);
  if (ir->condition != (ir_rvalue *)0x0) {
    return visit_continue;
  }
  piVar12 = ir_assignment::whole_variable_written(ir);
  piVar4 = ir->rhs;
  iVar2 = (piVar4->super_ir_instruction).ir_type;
  piVar13 = (ir_rvalue *)0x0;
  if (iVar2 == ir_type_dereference_variable) {
    piVar13 = piVar4;
  }
  if (((piVar12 != (ir_variable *)0x0) && (piVar13 != (ir_rvalue *)0x0)) &&
     (piVar5 = (ir_variable *)piVar13[1].super_ir_instruction._vptr_ir_instruction,
     piVar12 != piVar5 && piVar5 != (ir_variable *)0x0)) {
    if ((*(uint *)&piVar12->data & 0xe000) == 0x2000) {
      return visit_continue;
    }
    if ((*(uint *)&piVar5->data & 0xe000) == 0x2000) {
      return visit_continue;
    }
    if (((*(uint *)&piVar5->data ^ *(uint *)&piVar12->data) & 0x40) != 0) {
      return visit_continue;
    }
    copy_propagation_state::write_full(this->state,piVar12,piVar5);
    return visit_continue;
  }
  local_48 = 0x100000000;
  uStack_40 = 0x300000002;
  piVar6 = ir->lhs;
  if (piVar6 == (ir_dereference *)0x0) {
    return visit_continue;
  }
  if ((piVar6->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_dereference_variable) {
    return visit_continue;
  }
  pgVar7 = (piVar6->super_ir_rvalue).type;
  if ((pgVar7->vector_elements != 1 || 0xd < (*(uint *)&pgVar7->field_0x4 & 0xfe)) &&
     (0xb < (*(uint *)&pgVar7->field_0x4 & 0xfc) ||
      (pgVar7->matrix_columns != '\x01' || pgVar7->vector_elements < 2))) {
    return visit_continue;
  }
  piVar12 = (ir_variable *)piVar6[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction;
  uVar15 = *(uint *)&piVar12->data;
  if ((uVar15 & 0xe000) == 0x2000) {
    return visit_continue;
  }
  if (piVar13 != (ir_rvalue *)0x0) goto LAB_00180d87;
  if (piVar4 == (ir_rvalue *)0x0 || iVar2 != ir_type_swizzle) {
LAB_00180d7d:
    piVar13 = (ir_rvalue *)0x0;
    bVar9 = false;
  }
  else {
    piVar13 = (ir_rvalue *)piVar4[1].super_ir_instruction._vptr_ir_instruction;
    if ((piVar13->super_ir_instruction).ir_type != ir_type_dereference_variable) {
      piVar13 = (ir_rvalue *)0x0;
    }
    if (piVar13 == (ir_rvalue *)0x0) goto LAB_00180d7d;
    uVar1 = *(ushort *)&piVar4[1].super_ir_instruction.super_exec_node.next;
    local_48 = (ulong)CONCAT24(uVar1 >> 2,(uint)uVar1) & 0x300000003;
    uStack_40 = (ulong)CONCAT24(uVar1 >> 6,(uint)(uVar1 >> 4)) & 0x300000003;
    bVar9 = true;
  }
  if (!bVar9) {
    return visit_continue;
  }
LAB_00180d87:
  piVar5 = (ir_variable *)piVar13[1].super_ir_instruction._vptr_ir_instruction;
  uVar3 = *(uint *)&piVar5->data;
  if ((uVar3 & 0xe000) != 0x2000) {
    uVar16 = (byte)ir->field_0x38 & 0xf;
    lVar14 = 0;
    iVar10 = 0;
    do {
      if ((uVar16 >> ((uint)lVar14 & 0x1f) & 1) != 0) {
        lVar17 = (long)iVar10;
        iVar10 = iVar10 + 1;
        local_38[lVar14] = *(int *)((long)&local_48 + lVar17 * 4);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    write_mask = uVar16;
    if (piVar12 == piVar5) {
      lVar14 = 0;
      do {
        bVar8 = (byte)lVar14 & 0x1f;
        uVar18 = -2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8;
        if ((uVar16 >> (*(uint *)((long)&local_48 + lVar14 * 4) & 0x1f) & 1) == 0) {
          uVar18 = 0xffffffff;
        }
        write_mask = write_mask & uVar18;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
    }
    if (((uVar3 ^ uVar15) & 0x40) == 0) {
      copy_propagation_state::write_elements(this->state,piVar12,piVar5,write_mask,local_38);
    }
  }
  return visit_continue;
}

Assistant:

ir_visitor_status
ir_copy_propagation_elements_visitor::visit_leave(ir_assignment *ir)
{
   ir_dereference_variable *lhs = ir->lhs->as_dereference_variable();
   ir_variable *var = ir->lhs->variable_referenced();

   kill_entry *k;

   if (lhs && var->type->is_vector())
      k = new(this->lin_ctx) kill_entry(var, ir->write_mask);
   else
      k = new(this->lin_ctx) kill_entry(var, ~0);

   kill(k);

   add_copy(ir);

   return visit_continue;
}